

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_listener_register_ppc(MemoryListener *listener,AddressSpace *as)

{
  AddressSpace *as_local;
  MemoryListener *listener_local;
  
  listener->address_space = as;
  (listener->link).tqe_next = (MemoryListener *)0x0;
  (listener->link).tqe_circ.tql_prev = (as->uc->memory_listeners).tqh_circ.tql_prev;
  ((as->uc->memory_listeners).tqh_circ.tql_prev)->tql_next = listener;
  (as->uc->memory_listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link;
  (listener->link_as).tqe_next = (MemoryListener *)0x0;
  (listener->link_as).tqe_circ.tql_prev = (as->listeners).tqh_circ.tql_prev;
  ((as->listeners).tqh_circ.tql_prev)->tql_next = listener;
  (as->listeners).tqh_circ.tql_prev = (QTailQLink *)&listener->link_as;
  listener_add_address_space(listener,as);
  return;
}

Assistant:

void memory_listener_register(MemoryListener *listener, AddressSpace *as)
{
    listener->address_space = as;
    QTAILQ_INSERT_TAIL(&as->uc->memory_listeners, listener, link);
    QTAILQ_INSERT_TAIL(&as->listeners, listener, link_as);

    listener_add_address_space(listener, as);
}